

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_info.h
# Opt level: O0

void __thiscall pybind11::buffer_info::buffer_info(buffer_info *this,Py_buffer *view,bool ownview)

{
  int iVar1;
  int iVar2;
  void *ptr;
  ssize_t itemsize;
  char *__s;
  long *plVar3;
  bool bVar4;
  allocator<long> local_c1;
  vector<long,_std::allocator<long>_> local_c0;
  byte local_a2;
  allocator<long> local_a1;
  vector<long,_std::allocator<long>_> local_a0;
  any_container<long> local_88;
  any_container<long> local_70;
  allocator<char> local_41;
  string local_40;
  byte local_19;
  Py_buffer *pPStack_18;
  bool ownview_local;
  Py_buffer *view_local;
  buffer_info *this_local;
  
  ptr = view->buf;
  itemsize = view->itemsize;
  __s = view->format;
  local_19 = ownview;
  pPStack_18 = view;
  view_local = (Py_buffer *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,&local_41);
  iVar1 = pPStack_18->ndim;
  pybind11::detail::any_container<long>::any_container<long*,void>
            (&local_70,pPStack_18->shape,pPStack_18->shape + iVar1);
  local_a2 = 0;
  bVar4 = pPStack_18->strides == (Py_ssize_t *)0x0;
  if (bVar4) {
    plVar3 = pPStack_18->shape;
    iVar2 = pPStack_18->ndim;
    std::allocator<long>::allocator(&local_c1);
    std::vector<long,std::allocator<long>>::vector<long*,void>
              ((vector<long,std::allocator<long>> *)&local_c0,plVar3,plVar3 + iVar2,&local_c1);
    pybind11::detail::c_strides(&local_a0,&local_c0,pPStack_18->itemsize);
  }
  else {
    plVar3 = pPStack_18->strides;
    iVar2 = pPStack_18->ndim;
    std::allocator<long>::allocator(&local_a1);
    local_a2 = 1;
    std::vector<long,std::allocator<long>>::vector<long*,void>
              ((vector<long,std::allocator<long>> *)&local_a0,plVar3,plVar3 + iVar2,&local_a1);
  }
  pybind11::detail::any_container<long>::any_container(&local_88,&local_a0);
  buffer_info(this,ptr,itemsize,&local_40,(long)iVar1,&local_70,&local_88,pPStack_18->readonly != 0)
  ;
  pybind11::detail::any_container<long>::~any_container(&local_88);
  std::vector<long,_std::allocator<long>_>::~vector(&local_a0);
  if (bVar4) {
    std::vector<long,_std::allocator<long>_>::~vector(&local_c0);
    std::allocator<long>::~allocator(&local_c1);
  }
  if ((local_a2 & 1) != 0) {
    std::allocator<long>::~allocator(&local_a1);
  }
  pybind11::detail::any_container<long>::~any_container(&local_70);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  this->m_view = pPStack_18;
  this->ownview = (bool)(local_19 & 1);
  return;
}

Assistant:

explicit buffer_info(Py_buffer *view, bool ownview = true)
    : buffer_info(view->buf, view->itemsize, view->format, view->ndim,
            {view->shape, view->shape + view->ndim},
            /* Though buffer::request() requests PyBUF_STRIDES, ctypes objects
             * ignore this flag and return a view with NULL strides.
             * When strides are NULL, build them manually.  */
            view->strides
            ? std::vector<ssize_t>(view->strides, view->strides + view->ndim)
            : detail::c_strides({view->shape, view->shape + view->ndim}, view->itemsize),
            view->readonly) {
        this->m_view = view;
        this->ownview = ownview;
    }